

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<long> __thiscall Omega_h::multiply_each_by<long>(Omega_h *this,Read<long> *a,long b)

{
  void *extraout_RDX;
  Read<long> RVar1;
  Write<long> local_e0;
  undefined1 local_d0 [8];
  type_conflict1 f;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  Write<long> c;
  long b_local;
  Read<long> *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr = (void *)b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  Write<long>::Write((Write<long> *)local_70,(LO)(local_10 >> 3),(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  Write<long>::Write((Write<long> *)local_d0,(Write<int> *)local_70);
  Read<long>::Read((Read<long> *)&f.c.shared_alloc_.direct_ptr,(Read<int> *)a);
  f.a.write_.shared_alloc_.direct_ptr = c.shared_alloc_.direct_ptr;
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::multiply_each_by<long>(Omega_h::Read<long>,long)::_lambda(int)_1_>
            ((LO)(local_20 >> 3),(type_conflict1 *)local_d0,"multiply_each_by");
  Write<long>::Write(&local_e0,(Write<int> *)local_70);
  Read<long>::Read((Read<long> *)this,&local_e0);
  Write<long>::~Write(&local_e0);
  multiply_each_by<long>(Omega_h::Read<long>,long)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_d0);
  Write<long>::~Write((Write<long> *)local_70);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> multiply_each_by(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] * b; };
  parallel_for(a.size(), f, "multiply_each_by");
  return c;
}